

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O1

void CoreMLConverter::unsupportedCaffeParrameterWithOption
               (string *parameterName,string *layerName,string *layerType,string *optionName)

{
  ostream *poVar1;
  runtime_error *this;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unsupported option \'",0x14);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(optionName->_M_dataplus)._M_p,optionName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' for the parameter \'",0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(parameterName->_M_dataplus)._M_p,parameterName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' in layer \'",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(layerName->_M_dataplus)._M_p,layerName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' of type \'",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(layerType->_M_dataplus)._M_p,layerType->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' during caffe conversion.",0x1a);
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_1d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void unsupportedCaffeParrameterWithOption(const std::string& parameterName,
                                                   const std::string& layerName,
                                                   const std::string& layerType,
                                                   const std::string& optionName) {
        
        std::stringstream ss;
        ss << "Unsupported option '" << optionName << "' for the parameter '"
           << parameterName << "' in layer '"<< layerName<< "' of type '" << layerType<< "' during caffe conversion."
           << std::endl;
        throw std::runtime_error(ss.str());
    }